

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  code *pcVar4;
  slot_type *psVar5;
  bool bVar6;
  undefined1 uVar7;
  reference ppVar8;
  pointer prVar9;
  __visit_result_t<google::protobuf::json_internal::SizeVisitor,_const_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>_&>
  _Var10;
  slot_type *psVar11;
  key_arg<int> kVar12;
  key_arg<int> kStack_3c;
  iterator iStack_38;
  iterator iStack_28;
  undefined8 uStack_18;
  undefined8 uStack_10;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       psVar1 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 != (slot_type *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
         psVar2 != (slot_type *)0x0) && ((char)*(code *)psVar2 < '\0')) goto LAB_002d2b95;
    if (psVar1 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        psVar2 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_002d2b7e:
      return psVar1 == psVar2;
    }
    if ((psVar1 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) ==
        (psVar2 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)) {
      if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_002d2b7e;
      if ((psVar2 == (slot_type *)&kSooControl) == (psVar1 == (slot_type *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar3 = (b->field_1).slot_;
        if (psVar1 == (slot_type *)&kSooControl) {
          if ((slot_type *)a == psVar3) goto LAB_002d2b7e;
        }
        else {
          psVar11 = psVar3;
          psVar5 = psVar2;
          b = (iterator *)(slot_type *)a;
          if (psVar2 < psVar1) {
            psVar11 = (slot_type *)a;
            psVar5 = psVar1;
            b = (iterator *)psVar3;
          }
          if ((psVar5 < b) && (b <= psVar11)) goto LAB_002d2b7e;
        }
      }
      uStack_10 = 0x2d2b90;
      operator==();
      goto LAB_002d2b90;
    }
  }
  else {
LAB_002d2b90:
    uStack_10 = 0x2d2b95;
    operator==();
LAB_002d2b95:
    uStack_10 = 0x2d2b9a;
    operator==();
  }
  kVar12 = (key_arg<int>)b;
  uStack_10 = 0x2d2b9f;
  operator==();
  pcVar4 = *(code **)a;
  if (pcVar4 == (code *)0x0) {
    uStack_18 = 0x2d2bc9;
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
    ::iterator::operator->((iterator *)a);
LAB_002d2bc9:
    uStack_18 = 0x2d2bce;
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
    ::iterator::operator->((iterator *)a);
  }
  else {
    if (pcVar4 == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)
    goto LAB_002d2bc9;
    if (-1 < (char)*pcVar4) {
      ppVar8 = raw_hash_set<$2385b75b$>::iterator::operator*(a);
      return SUB81(ppVar8,0);
    }
  }
  uStack_18 = 0x2d2bd3;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
  ::iterator::operator->((iterator *)a);
  pcVar4 = *(code **)a;
  if (pcVar4 == (code *)0x0) {
    iStack_28.field_1.slot_ = (slot_type *)0x2d2bfd;
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
    ::iterator::operator*((iterator *)a);
  }
  else if (pcVar4 != absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
    if (-1 < (char)*pcVar4) {
      return SUB81(*(undefined8 *)
                    &(((value_type *)a)->second).
                     super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                     .
                     super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     ._M_u,0);
    }
    goto LAB_002d2c02;
  }
  iStack_28.field_1.slot_ = (slot_type *)0x2d2c02;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
  ::iterator::operator*((iterator *)a);
LAB_002d2c02:
  iStack_28.field_1.slot_ = (slot_type *)0x2d2c07;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>>>>
  ::iterator::operator*((iterator *)a);
  kStack_3c = kVar12;
  iStack_28 = raw_hash_set<$2385b75b$>::find<int>
                        ((raw_hash_set<_2385b75b_> *)&((value_type *)a)->second,&kStack_3c);
  iStack_38.ctrl_ = (ctrl_t *)0x0;
  bVar6 = operator==(&iStack_28,&iStack_38);
  if (bVar6) {
    uVar7 = 0;
  }
  else {
    prVar9 = raw_hash_set<$2385b75b$>::iterator::operator->(&iStack_28);
    _Var10 = std::
             visit<google::protobuf::json_internal::SizeVisitor,std::variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>const&>
                       ((SizeVisitor *)&iStack_38,&prVar9->second);
    uVar7 = (undefined1)_Var10;
  }
  return (bool)uVar7;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }